

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall TPZVec<char>::TPZVec(TPZVec<char> *this,TPZVec<char> *rval)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b730;
  uVar1 = rval->fNElements;
  this->fNElements = uVar1;
  lVar3 = rval->fNAlloc;
  if (lVar3 == 0) {
    pcVar2 = (char *)operator_new__(uVar1);
    this->fStore = pcVar2;
    if (0 < this->fNElements) {
      lVar3 = 0;
      do {
        this->fStore[lVar3] = rval->fStore[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->fNElements);
    }
  }
  else {
    this->fStore = rval->fStore;
    this->fNAlloc = lVar3;
    rval->fStore = (char *)0x0;
    rval->fNAlloc = 0;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec(TPZVec<T> &&rval) : fNElements(rval.fNElements){
    if(rval.fNAlloc){
        fStore = rval.fStore;
        fNAlloc = rval.fNAlloc;
        rval.fStore = nullptr;
        rval.fNAlloc = 0;
    }else{//rval did not allocate memory. let us just copy
        fStore = new T[fNElements];
        for(int64_t i=0; i<fNElements; i++)
            fStore[i]=rval.fStore[i];
    }
    
}